

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

int __thiscall despot::TabularCPT::ComputeIndex(TabularCPT *this,int pid,double *sum)

{
  double dVar1;
  pointer pvVar2;
  pointer ppVar3;
  pointer pvVar4;
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  
  pvVar2 = (this->sparse_values_).
           super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->sparse_values_).
      super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == pvVar2) {
    pvVar4 = (this->super_CPT).super_Function.values_.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar7 = *(long *)&pvVar4[pid].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
    lVar8 = (long)*(pointer *)
                   ((long)&pvVar4[pid].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data + 8) - lVar7;
    if (lVar8 != 0) {
      dVar9 = *sum;
      lVar8 = lVar8 >> 3;
      uVar5 = 0;
      do {
        dVar1 = *(double *)(lVar7 + uVar5 * 8);
        if (dVar9 < dVar1) {
          *sum = dVar9 / (dVar1 * 1.000000001);
          goto LAB_00146f59;
        }
        dVar9 = dVar9 - dVar1;
        *sum = dVar9;
        uVar5 = uVar5 + 1;
      } while (lVar8 + (ulong)(lVar8 == 0) != uVar5);
    }
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/parser/function.cpp"
                  ,0x16d,"virtual int despot::TabularCPT::ComputeIndex(int, double &) const");
  }
  ppVar3 = pvVar2[pid].
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = 0xffffffff;
  lVar7 = (long)pvVar2[pid].
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3;
  if (lVar7 != 0) {
    dVar9 = *sum;
    lVar7 = lVar7 >> 4;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    pdVar6 = &ppVar3->second;
    do {
      dVar1 = *pdVar6;
      if (dVar9 < dVar1) {
        *sum = dVar9 / (dVar1 * 1.000000001);
        uVar5 = (ulong)(uint)((pair<int,_double> *)(pdVar6 + -1))->first;
        break;
      }
      dVar9 = dVar9 - dVar1;
      *sum = dVar9;
      pdVar6 = pdVar6 + 2;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
LAB_00146f59:
  return (int)uVar5;
}

Assistant:

int TabularCPT::ComputeIndex(int pid, double& sum) const {
	if (sparse_values_.size() != 0) {
		for (int i = 0; i < sparse_values_[pid].size(); i++) {
			const pair<int, double>& pair = sparse_values_[pid][i];
			if (sum < pair.second) {
				sum /= pair.second * (1 + 1E-9);
				return pair.first;
			}
			sum -= pair.second;
		}
		return -1;
	} else {
		for (int cur = 0; cur < values_[pid].size(); cur++) {
			if (sum < values_[pid][cur]) {
				sum /= values_[pid][cur] * (1 + 1E-9);
				return cur;
			}
			sum -= values_[pid][cur];
		}
	}

	assert(false);
	return -1;
}